

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O0

SampledSpectrum __thiscall
pbrt::PathIntegrator::SampleLd
          (PathIntegrator *this,SurfaceInteraction *intr,BSDF *bsdf,SampledWavelengths *lambda,
          SamplerHandle *sampler)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  LightSampleContext ctx;
  undefined1 auVar5 [16];
  Vector3f wiRender;
  undefined1 auVar6 [16];
  SampledWavelengths lambda_00;
  Vector3f woRender;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  Vector3f wiRender_00;
  undefined1 auVar10 [16];
  Vector3f woRender_00;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  array<float,_4> aVar16;
  bool bVar17;
  LightType type;
  int iVar18;
  SampledLight *pSVar19;
  undefined8 *in_RCX;
  SurfaceInteraction *in_RSI;
  long *in_FS_OFFSET;
  Point2f PVar20;
  undefined8 extraout_XMM0_Qb;
  undefined8 uVar21;
  undefined8 uVar22;
  SampledSpectrum SVar23;
  Float weight;
  Float bsdfPDF;
  Float lightPDF;
  SampledSpectrum f;
  Vector3f wi;
  Vector3f wo;
  LightLiSample ls;
  LightHandle light;
  Point2f uLight;
  optional<pbrt::SampledLight> sampledLight;
  SamplerHandle *in_stack_fffffffffffffbc8;
  Float FVar24;
  SamplerHandle *in_stack_fffffffffffffbd0;
  Interval<float> s;
  Interval<float> this_00;
  undefined8 in_stack_fffffffffffffbe8;
  LightSampleContext *in_stack_fffffffffffffbf0;
  LightSamplerHandle *in_stack_fffffffffffffbf8;
  Interaction *p0;
  Integrator *this_01;
  LightSamplingMode in_stack_fffffffffffffc2c;
  LightHandle *in_stack_fffffffffffffc30;
  Tuple2<pbrt::Point2,_float> in_stack_fffffffffffffc38;
  BxDFReflTransFlags in_stack_fffffffffffffc48;
  TransportMode in_stack_fffffffffffffc4c;
  BSDF *in_stack_fffffffffffffc50;
  undefined8 in_stack_fffffffffffffc58;
  undefined8 in_stack_fffffffffffffc60;
  undefined8 in_stack_fffffffffffffc68;
  float in_stack_fffffffffffffc70;
  undefined4 in_stack_fffffffffffffc74;
  undefined4 in_stack_fffffffffffffc78;
  float in_stack_fffffffffffffc7c;
  undefined4 in_stack_fffffffffffffc80;
  undefined4 in_stack_fffffffffffffc84;
  undefined8 in_stack_fffffffffffffc88;
  float in_stack_fffffffffffffc90;
  undefined4 in_stack_fffffffffffffc94;
  undefined4 in_stack_fffffffffffffc98;
  float in_stack_fffffffffffffc9c;
  BSDF *in_stack_fffffffffffffca0;
  undefined8 in_stack_fffffffffffffcb8;
  float in_stack_fffffffffffffcc0;
  undefined4 uStack_33c;
  undefined8 in_stack_fffffffffffffcd8;
  float in_stack_fffffffffffffce0;
  __0 local_251;
  Tuple3<pbrt::Vector3,_float> local_250;
  undefined8 local_240;
  float local_238;
  Tuple3<pbrt::Vector3,_float> local_230;
  undefined8 local_220;
  float local_218;
  Float local_210;
  undefined8 local_20c;
  undefined8 local_204;
  float local_1fc;
  Tuple3<pbrt::Vector3,_float> local_1f8;
  undefined8 local_1e8;
  float local_1e0;
  Tuple3<pbrt::Vector3,_float> local_1d8;
  undefined8 local_1c8;
  float local_1c0;
  undefined8 local_1b8;
  undefined8 local_1b0;
  undefined8 local_1a8;
  undefined8 local_1a0;
  Tuple3<pbrt::Vector3,_float> local_198;
  undefined8 local_188;
  float local_180;
  Interaction *local_178;
  Integrator *pIStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 local_150;
  undefined1 local_148 [48];
  LightLiSample local_118;
  undefined4 local_98;
  undefined8 local_88;
  LightSampleContext local_80;
  optional local_50 [32];
  undefined8 *local_30;
  SurfaceInteraction *local_20;
  undefined8 local_10;
  undefined8 local_8;
  
  FVar24 = (Float)((ulong)in_stack_fffffffffffffbe8 >> 0x20);
  local_30 = in_RCX;
  local_20 = in_RSI;
  LightSampleContext::LightSampleContext(&local_80,in_RSI);
  SamplerHandle::Get1D(in_stack_fffffffffffffbd0);
  LightSamplerHandle::Sample(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0,FVar24);
  PVar20 = SamplerHandle::Get2D(in_stack_fffffffffffffbc8);
  auVar15._8_8_ = extraout_XMM0_Qb;
  auVar15._0_4_ = PVar20.super_Tuple2<pbrt::Point2,_float>.x;
  auVar15._4_4_ = PVar20.super_Tuple2<pbrt::Point2,_float>.y;
  local_88 = vmovlpd_avx(auVar15);
  bVar17 = pstd::optional::operator_cast_to_bool(local_50);
  if (bVar17) {
    pstd::optional<pbrt::SampledLight>::operator->((optional<pbrt::SampledLight> *)0x79d97e);
    LightHandle::LightHandle
              ((LightHandle *)in_stack_fffffffffffffbd0,(LightHandle *)in_stack_fffffffffffffbc8);
    LightSampleContext::LightSampleContext((LightSampleContext *)local_148,local_20);
    local_150 = local_88;
    p0 = (Interaction *)*local_30;
    this_01 = (Integrator *)local_30[1];
    uStack_168 = local_30[2];
    uStack_160 = local_30[3];
    ctx.pi.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y
    .low = (float)(int)in_stack_fffffffffffffc58;
    ctx.pi.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y
    .high = (float)(int)((ulong)in_stack_fffffffffffffc58 >> 0x20);
    ctx.pi.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x
         = (Interval<float>)in_stack_fffffffffffffc50;
    ctx.pi.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z
    .low = (float)(int)in_stack_fffffffffffffc60;
    ctx.pi.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z
    .high = (float)(int)((ulong)in_stack_fffffffffffffc60 >> 0x20);
    ctx.n.super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)in_stack_fffffffffffffc68;
    ctx.n.super_Tuple3<pbrt::Normal3,_float>.y =
         (float)(int)((ulong)in_stack_fffffffffffffc68 >> 0x20);
    ctx.n.super_Tuple3<pbrt::Normal3,_float>.z = in_stack_fffffffffffffc70;
    ctx.ns.super_Tuple3<pbrt::Normal3,_float>.x = (float)in_stack_fffffffffffffc74;
    ctx.ns.super_Tuple3<pbrt::Normal3,_float>.y = (float)in_stack_fffffffffffffc78;
    ctx.ns.super_Tuple3<pbrt::Normal3,_float>.z = in_stack_fffffffffffffc7c;
    lambda_00.lambda.values[1] = (float)in_stack_fffffffffffffc84;
    lambda_00.lambda.values[0] = (float)in_stack_fffffffffffffc80;
    lambda_00.lambda.values[2] = (float)(int)in_stack_fffffffffffffc88;
    lambda_00.lambda.values[3] = (float)(int)((ulong)in_stack_fffffffffffffc88 >> 0x20);
    lambda_00.pdf.values[0] = in_stack_fffffffffffffc90;
    lambda_00.pdf.values[1] = (float)in_stack_fffffffffffffc94;
    lambda_00.pdf.values[2] = (float)in_stack_fffffffffffffc98;
    lambda_00.pdf.values[3] = in_stack_fffffffffffffc9c;
    local_178 = p0;
    pIStack_170 = this_01;
    LightHandle::SampleLi
              (in_stack_fffffffffffffc30,ctx,(Point2f)in_stack_fffffffffffffc38,lambda_00,
               in_stack_fffffffffffffc2c);
    bVar17 = LightLiSample::operator_cast_to_bool(&local_118);
    if ((bVar17) &&
       (bVar17 = SampledSpectrum::operator_cast_to_bool((SampledSpectrum *)local_148._16_8_), bVar17
       )) {
      local_1e0 = (local_20->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.z;
      local_1e8._0_4_ = (local_20->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.x;
      local_1e8._4_4_ = (local_20->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.y;
      local_198.z = local_118.wi.super_Tuple3<pbrt::Vector3,_float>.z;
      local_198.x = local_118.wi.super_Tuple3<pbrt::Vector3,_float>.x;
      local_198.y = local_118.wi.super_Tuple3<pbrt::Vector3,_float>.y;
      local_1d8.z = local_118.wi.super_Tuple3<pbrt::Vector3,_float>.z;
      local_1d8.x = local_118.wi.super_Tuple3<pbrt::Vector3,_float>.x;
      local_1d8.y = local_118.wi.super_Tuple3<pbrt::Vector3,_float>.y;
      uVar21 = 0;
      uVar22 = 0;
      local_1f8.z = local_118.wi.super_Tuple3<pbrt::Vector3,_float>.z;
      local_1f8.x = local_118.wi.super_Tuple3<pbrt::Vector3,_float>.x;
      local_1f8.y = local_118.wi.super_Tuple3<pbrt::Vector3,_float>.y;
      woRender_00.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffce0;
      woRender_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_fffffffffffffcd8;
      woRender_00.super_Tuple3<pbrt::Vector3,_float>.y =
           (float)(int)((ulong)in_stack_fffffffffffffcd8 >> 0x20);
      wiRender_00.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffcc0;
      wiRender_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_fffffffffffffcb8;
      wiRender_00.super_Tuple3<pbrt::Vector3,_float>.y =
           (float)(int)((ulong)in_stack_fffffffffffffcb8 >> 0x20);
      local_1c8 = local_1e8;
      local_1c0 = local_1e0;
      local_188 = local_1e8;
      local_180 = local_1e0;
      SVar23 = BSDF::f(in_stack_fffffffffffffca0,woRender_00,wiRender_00,
                       (TransportMode)in_stack_fffffffffffffc9c);
      auVar13._8_8_ = uVar22;
      auVar13._0_8_ = SVar23.values.values._8_8_;
      auVar14._8_8_ = uVar21;
      auVar14._0_8_ = SVar23.values.values._0_8_;
      local_1b8 = vmovlpd_avx(auVar14);
      local_1b0 = vmovlpd_avx(auVar13);
      AbsDot<float>((Vector3<float> *)local_148._8_8_,(Normal3<float> *)local_148._0_8_);
      uVar22 = 0;
      FVar24 = SUB84(local_148._0_8_,4);
      SVar23 = SampledSpectrum::operator*((SampledSpectrum *)local_148._8_8_,FVar24);
      auVar11._8_8_ = uVar21;
      auVar11._0_8_ = SVar23.values.values._8_8_;
      auVar12._8_8_ = uVar22;
      auVar12._0_8_ = SVar23.values.values._0_8_;
      local_1a8 = vmovlpd_avx(auVar12);
      local_1a0 = vmovlpd_avx(auVar11);
      bVar17 = SampledSpectrum::operator_cast_to_bool((SampledSpectrum *)local_148._16_8_);
      if ((bVar17) &&
         (bVar17 = Integrator::Unoccluded(this_01,p0,(Interaction *)local_148._40_8_), bVar17)) {
        pSVar19 = pstd::optional<pbrt::SampledLight>::operator->
                            ((optional<pbrt::SampledLight> *)0x79dcc8);
        uVar22 = 0;
        local_1fc = pSVar19->pdf * local_118.pdf;
        uVar21 = 0;
        type = LightHandle::Type((LightHandle *)local_148._8_8_);
        bVar17 = IsDeltaLight(type);
        if (bVar17) {
          SVar23 = SampledSpectrum::operator*
                             ((SampledSpectrum *)local_148._16_8_,(SampledSpectrum *)local_148._8_8_
                             );
          uStack_33c = (undefined4)((ulong)uVar21 >> 0x20);
          auVar9._8_8_ = uVar22;
          auVar9._0_8_ = SVar23.values.values._8_8_;
          auVar10._8_4_ = (int)uVar21;
          auVar10._0_8_ = SVar23.values.values._0_8_;
          auVar10._12_4_ = uStack_33c;
          uVar21 = auVar10._8_8_;
          local_20c = vmovlpd_avx(auVar10);
          local_204 = vmovlpd_avx(auVar9);
          uVar22 = 0;
          SVar23 = SampledSpectrum::operator/
                             ((SampledSpectrum *)local_148._16_8_,SUB84(local_148._8_8_,4));
          auVar7._8_4_ = (int)uVar21;
          auVar7._0_8_ = SVar23.values.values._8_8_;
          auVar7._12_4_ = (int)((ulong)uVar21 >> 0x20);
          auVar8._8_8_ = uVar22;
          auVar8._0_8_ = SVar23.values.values._0_8_;
          local_10 = vmovlpd_avx(auVar8);
          local_8 = vmovlpd_avx(auVar7);
        }
        else {
          local_218 = local_180;
          local_220 = local_188;
          local_230.z = local_198.z;
          local_230.x = local_198.x;
          local_230.y = local_198.y;
          local_238 = local_180;
          local_240 = local_188;
          local_250.z = local_198.z;
          local_250.x = local_198.x;
          local_250.y = local_198.y;
          woRender.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffc90;
          woRender.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_fffffffffffffc88;
          woRender.super_Tuple3<pbrt::Vector3,_float>.y =
               (float)(int)((ulong)in_stack_fffffffffffffc88 >> 0x20);
          wiRender.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffc70;
          wiRender.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_fffffffffffffc68;
          wiRender.super_Tuple3<pbrt::Vector3,_float>.y =
               (float)(int)((ulong)in_stack_fffffffffffffc68 >> 0x20);
          local_210 = BSDF::PDF(in_stack_fffffffffffffc50,woRender,wiRender,
                                in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48);
          s = (Interval<float>)local_148._8_8_;
          this_00 = (Interval<float>)local_148._16_8_;
          if ((SampleLd(pbrt::SurfaceInteraction_const&,pbrt::BSDF_const&,pbrt::SampledWavelengths&,pbrt::SamplerHandle)
               ::reg == '\0') &&
             (iVar18 = __cxa_guard_acquire(&SampleLd(pbrt::SurfaceInteraction_const&,pbrt::BSDF_const&,pbrt::SampledWavelengths&,pbrt::SamplerHandle)
                                            ::reg), s = (Interval<float>)local_148._8_8_,
             this_00 = (Interval<float>)local_148._16_8_, iVar18 != 0)) {
            SampleLd(pbrt::SurfaceInteraction_const&,pbrt::BSDF_const&,pbrt::SampledWavelengths&,pbrt::SamplerHandle)_const
            ::$_0::operator_cast_to_function_pointer(&local_251);
            StatRegisterer::StatRegisterer
                      ((StatRegisterer *)this_01,(AccumFunc)p0,(PixelAccumFunc)local_148._40_8_);
            __cxa_guard_release(&SampleLd(pbrt::SurfaceInteraction_const&,pbrt::BSDF_const&,pbrt::SampledWavelengths&,pbrt::SamplerHandle)
                                 ::reg);
            s = (Interval<float>)local_148._8_8_;
            this_00 = (Interval<float>)local_148._16_8_;
          }
          in_FS_OFFSET[-0x52] = in_FS_OFFSET[-0x52] + 1;
          bVar17 = BSDF::SampledPDFIsProportional((BSDF *)0x79df12);
          if (((!bVar17) && (local_210 == 0.0)) && (!NAN(local_210))) {
            *(long *)(*in_FS_OFFSET + -0x298) = *(long *)(*in_FS_OFFSET + -0x298) + 1;
          }
          uVar22 = 0;
          PowerHeuristic(1,local_1fc,1,local_210);
          uVar21 = 0;
          SVar23 = SampledSpectrum::operator*((SampledSpectrum *)this_00,(SampledSpectrum *)s);
          auVar5._8_8_ = uVar22;
          auVar5._0_8_ = SVar23.values.values._8_8_;
          auVar6._8_4_ = (int)uVar21;
          auVar6._0_8_ = SVar23.values.values._0_8_;
          auVar6._12_4_ = (int)((ulong)uVar21 >> 0x20);
          uVar21 = auVar6._8_8_;
          vmovlpd_avx(auVar6);
          vmovlpd_avx(auVar5);
          uVar22 = 0;
          SVar23 = SampledSpectrum::operator*((SampledSpectrum *)s,FVar24);
          auVar3._8_8_ = uVar21;
          auVar3._0_8_ = SVar23.values.values._8_8_;
          auVar4._8_8_ = uVar22;
          auVar4._0_8_ = SVar23.values.values._0_8_;
          vmovlpd_avx(auVar4);
          vmovlpd_avx(auVar3);
          uVar21 = 0;
          SVar23 = SampledSpectrum::operator/((SampledSpectrum *)this_00,s.high);
          auVar1._8_8_ = uVar22;
          auVar1._0_8_ = SVar23.values.values._8_8_;
          auVar2._8_8_ = uVar21;
          auVar2._0_8_ = SVar23.values.values._0_8_;
          local_10 = vmovlpd_avx(auVar2);
          local_8 = vmovlpd_avx(auVar1);
        }
      }
      else {
        memset(&local_10,0,0x10);
        SampledSpectrum::SampledSpectrum((SampledSpectrum *)0x79dcab);
      }
    }
    else {
      memset(&local_10,0,0x10);
      SampledSpectrum::SampledSpectrum((SampledSpectrum *)0x79da93);
    }
  }
  else {
    memset(&local_10,0,0x10);
    SampledSpectrum::SampledSpectrum((SampledSpectrum *)0x79d948);
  }
  local_98 = 1;
  pstd::optional<pbrt::SampledLight>::~optional((optional<pbrt::SampledLight> *)0x79e0b0);
  aVar16.values[2] = (float)(undefined4)local_8;
  aVar16.values[3] = (float)local_8._4_4_;
  aVar16.values[0] = (float)(undefined4)local_10;
  aVar16.values[1] = (float)local_10._4_4_;
  return (array<float,_4>)(array<float,_4>)aVar16.values;
}

Assistant:

SampledSpectrum PathIntegrator::SampleLd(const SurfaceInteraction &intr, const BSDF &bsdf,
                                         SampledWavelengths &lambda,
                                         SamplerHandle sampler) const {
    // Choose a light source for the direct lighting calculation
    pstd::optional<SampledLight> sampledLight =
        lightSampler.Sample(intr, sampler.Get1D());
    Point2f uLight = sampler.Get2D();
    if (!sampledLight)
        return {};
    LightHandle light = sampledLight->light;
    DCHECK(light != nullptr && sampledLight->pdf > 0);

    // Sample a point on the light source for direct lighting
    LightLiSample ls = light.SampleLi(intr, uLight, lambda, LightSamplingMode::WithMIS);
    if (!ls || !ls.L)
        return {};

    // Evaluate BSDF for light sample and check light visibility
    Vector3f wo = intr.wo, wi = ls.wi;
    SampledSpectrum f = bsdf.f(wo, wi) * AbsDot(wi, intr.shading.n);
    if (!f || !Unoccluded(intr, ls.pLight))
        return {};

    // Return light's contribution to reflected radiance
    Float lightPDF = sampledLight->pdf * ls.pdf;
    if (IsDeltaLight(light.Type()))
        return f * ls.L / lightPDF;
    else {
        Float bsdfPDF = bsdf.PDF(wo, wi);
        CHECK_RARE(1e-6, bsdf.SampledPDFIsProportional() == false && bsdfPDF == 0);
        Float weight = PowerHeuristic(1, lightPDF, 1, bsdfPDF);
        return f * ls.L * weight / lightPDF;
    }
}